

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O1

Variant * Jinx::Impl::IsFinished
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  Script *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pVVar1;
  bool value;
  char *message;
  undefined8 *local_20;
  undefined8 local_18;
  
  this = (Script *)(script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pVVar1 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 == (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
    message = "\'is finished\' function invoked with no parameters";
  }
  else {
    if (pVVar1->m_type == Coroutine) {
      Variant::GetCoroutine((Variant *)&local_20);
      value = (bool)(**(code **)*local_20)();
      __return_storage_ptr__->m_type = Null;
      Variant::SetBoolean(__return_storage_ptr__,value);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
      }
      goto LAB_0011b103;
    }
    message = "Invalid parameters to \'is finished\' function";
  }
  Script::Error(this,message);
  __return_storage_ptr__->m_type = Null;
  Variant::SetNull(__return_storage_ptr__);
LAB_0011b103:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant IsFinished(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'is finished' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsCoroutine())
		{
			s->Error("Invalid parameters to 'is finished' function");
			return nullptr;
		}
		return params[0].GetCoroutine()->IsFinished();
	}